

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_flow.h
# Opt level: O2

void __thiscall max_flow_algo::discharge(max_flow_algo *this,NodeID node)

{
  int iVar1;
  pointer pvVar2;
  long lVar3;
  int i;
  ulong uVar4;
  
  uVar4 = 0;
  while( true ) {
    pvVar2 = (this->adj->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar3 = *(long *)&pvVar2[node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    iVar1 = (this->m_excess).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[node];
    if ((ulong)((long)*(pointer *)
                       ((long)&pvVar2[node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + 8) - lVar3 >> 2) <= uVar4) break;
    if (iVar1 < 1) {
      return;
    }
    iVar1 = *(int *)(lVar3 + uVar4 * 4);
    if ((this->active->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start[iVar1] < 0) {
      push(this,node,iVar1,(int)uVar4);
    }
    uVar4 = uVar4 + 1;
  }
  if (iVar1 < 1) {
    return;
  }
  iVar1 = (this->m_distance).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[node];
  if (((this->m_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start[iVar1] == 1) && (iVar1 < this->rn)) {
    gap_heuristic(this,iVar1);
    return;
  }
  relabel(this,node);
  return;
}

Assistant:

void discharge(NodeID node)
    {

        for (int i = 0; i < adj[node].size() && m_excess[node] > 0; i++)
        {
            NodeID target = adj[node][i];
            if (isActive(target))
                push(node, target, i);
        }

        if (m_excess[node] > 0)
        {
            if (m_count[m_distance[node]] == 1 && m_distance[node] < rn)
            {
                // hence this layer will be empty after the relabel step
                gap_heuristic(m_distance[node]);
            }
            else
            {
                relabel(node);
            }
        }
    }